

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

HRESULT Js::TypedArrayBase::GetBuffer
                  (Var instance,ArrayBuffer **outBuffer,uint32 *outOffset,uint32 *outLength)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  TypedArrayBase *pTVar4;
  undefined4 extraout_var;
  ArrayBuffer *pAVar5;
  DataView *pDVar6;
  undefined4 extraout_var_00;
  
  bVar1 = VarIs<Js::TypedArrayBase>(instance);
  if (bVar1) {
    pTVar4 = VarTo<Js::TypedArrayBase>(instance);
    iVar2 = (*(((pTVar4->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x6e])();
    *outBuffer = (ArrayBuffer *)CONCAT44(extraout_var,iVar2);
    *outOffset = pTVar4->byteOffset;
    TVar3 = pTVar4->BYTES_PER_ELEMENT * (pTVar4->super_ArrayBufferParent).super_ArrayObject.length;
  }
  else {
    bVar1 = VarIs<Js::ArrayBuffer>(instance);
    if (bVar1) {
      pAVar5 = VarTo<Js::ArrayBuffer>(instance);
      *outBuffer = pAVar5;
      *outOffset = 0;
      TVar3 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(pAVar5);
    }
    else {
      bVar1 = VarIs<Js::DataView>(instance);
      if (!bVar1) {
        return -0x7ff8ffa9;
      }
      pDVar6 = VarTo<Js::DataView>(instance);
      iVar2 = (*(((pDVar6->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x6e])();
      *outBuffer = (ArrayBuffer *)CONCAT44(extraout_var_00,iVar2);
      *outOffset = pDVar6->byteOffset;
      TVar3 = (pDVar6->super_ArrayBufferParent).super_ArrayObject.length;
    }
  }
  *outLength = TVar3;
  return 0;
}

Assistant:

HRESULT TypedArrayBase::GetBuffer(Var instance, ArrayBuffer** outBuffer, uint32* outOffset, uint32* outLength)
    {
        HRESULT hr = NOERROR;
        if (Js::VarIs<Js::TypedArrayBase>(instance))
        {
            Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(instance);
            *outBuffer = typedArrayBase->GetArrayBuffer()->GetAsArrayBuffer();
            *outOffset = typedArrayBase->GetByteOffset();
            *outLength = typedArrayBase->GetByteLength();
        }
        else if (Js::VarIs<Js::ArrayBuffer>(instance))
        {
            Js::ArrayBuffer* buffer = Js::VarTo<Js::ArrayBuffer>(instance);
            *outBuffer = buffer;
            *outOffset = 0;
            *outLength = buffer->GetByteLength();
        }
        else if (Js::VarIs<Js::DataView>(instance))
        {
            Js::DataView* dView = Js::VarTo<Js::DataView>(instance);
            *outBuffer = dView->GetArrayBuffer()->GetAsArrayBuffer();
            *outOffset = dView->GetByteOffset();
            *outLength = dView->GetLength();
        }
        else
        {
            hr = E_INVALIDARG;
        }
        return hr;

    }